

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::ShaderFloatPrecisionCase::iterate(ShaderFloatPrecisionCase *this)

{
  ostringstream *stream;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  Float<unsigned_int,_8,_23,_127,_3U> FVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  long lVar7;
  ulong uVar8;
  IterateResult IVar9;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  ulong uVar10;
  float fVar11;
  float fVar12;
  allocator<char> local_431;
  float __tmp;
  undefined4 uStack_42c;
  ulong local_428;
  deUint64 u64;
  long local_418;
  TestLog *local_410;
  deUint32 local_404;
  float local_400;
  float local_3fc;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  vector<float,_std::allocator<float>_> pixels;
  deUint16 indices [6];
  float in1Arr [4];
  float in0Arr [4];
  float position [16];
  undefined1 local_330 [8];
  IndexType local_328;
  deUint16 *local_320;
  undefined1 local_1b0 [384];
  
  position[0xc] = 1.0;
  position[0xd] = 1.0;
  position[0xe] = 0.0;
  position[0xf] = 1.0;
  position[8] = 1.0;
  position[9] = -1.0;
  position[10] = 0.0;
  position[0xb] = 1.0;
  position[4] = -1.0;
  position[5] = 1.0;
  position[6] = 0.0;
  position[7] = 1.0;
  position[0] = -1.0;
  position[1] = -1.0;
  position[2] = 0.0;
  position[3] = 1.0;
  indices[0] = 0;
  indices[1] = 1;
  indices[2] = 2;
  indices[3] = 2;
  indices[4] = 1;
  indices[5] = 3;
  in0Arr[0] = 0.0;
  in0Arr[1] = 0.0;
  in0Arr[2] = 0.0;
  in0Arr[3] = 0.0;
  in1Arr[0] = 0.0;
  in1Arr[1] = 0.0;
  in1Arr[2] = 0.0;
  in1Arr[3] = 0.0;
  local_410 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::vector(&pixels,0x1000,(allocator_type *)local_330);
  local_404 = (this->m_program->m_program).m_program;
  (**(code **)(lVar7 + 0x1680))();
  (**(code **)(lVar7 + 0x78))(0x8d40,this->m_framebuffer);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"a_position",&local_431);
  glu::va::Float((VertexArrayBinding *)local_330,(string *)local_1b0,4,4,0,position);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_330);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"a_in0",&local_431);
  glu::va::Float((VertexArrayBinding *)local_330,(string *)local_1b0,1,4,0,in0Arr);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_330);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"a_in1",&local_431);
  glu::va::Float((VertexArrayBinding *)local_330,(string *)local_1b0,1,4,0,in1Arr);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_330);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)local_1b0);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"After program setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                  ,0x168);
  iVar3 = 0;
  local_418 = lVar7;
  do {
    if (this->m_numTestsPerIter <= iVar3) break;
    u64 = CONCAT44(u64._4_4_,(this->m_rangeA).m_data[0]);
    __tmp = (this->m_rangeA).m_data[1];
    local_3fc = deRandom_getFloat(&(this->m_rnd).m_rnd);
    local_400 = (this->m_rangeB).m_data[0];
    local_428._0_4_ = (this->m_rangeB).m_data[1];
    fVar11 = deRandom_getFloat(&(this->m_rnd).m_rnd);
    fVar12 = (__tmp - (float)u64) * local_3fc + (float)u64;
    fVar11 = ((float)local_428 - local_400) * fVar11 + local_400;
    ___tmp = CONCAT44(uStack_42c,fVar12);
    local_428 = CONCAT44(local_428._4_4_,fVar11);
    u64 = (deUint64)(*this->m_evalFunc)((double)fVar12,(double)fVar11);
    local_330 = (undefined1  [8])u64;
    FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
                      ((Float<unsigned_long,_11,_52,_1023,_3U> *)local_330);
    local_1b0._0_8_ = local_410;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"iter ");
    pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_iterNdx);
    stream = &pMVar6->m_str;
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,", test ");
    std::ostream::operator<<(stream,iVar3);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,": ");
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,"in0 = ");
    std::ostream::operator<<(stream,__tmp);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>," / ");
    tcu::Format::operator<<
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               (Hex<8UL>)(___tmp & 0xffffffff));
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,", in1 = ");
    std::ostream::operator<<(stream,(float)local_428);
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>," / ");
    tcu::Format::operator<<
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               (Hex<8UL>)(local_428 & 0xffffffff));
    local_330 = (undefined1  [8])
                tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
    std::operator<<((ostream *)&local_328,"  reference = ");
    std::ostream::operator<<((ostringstream *)&local_328,(float)FVar5.m_value);
    std::operator<<((ostream *)&local_328," / ");
    hex.value._4_4_ = 0;
    hex.value._0_4_ = FVar5.m_value;
    tcu::Format::operator<<((ostream *)&local_328,hex);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
      *(float *)((long)in0Arr + lVar7) = __tmp;
    }
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
      *(float *)((long)in1Arr + lVar7) = (float)local_428;
    }
    local_330 = (undefined1  [8])0x600000000;
    local_328 = INDEXTYPE_UINT16;
    local_320 = indices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_404,
              (int)(((long)vertexArrays.
                           super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vertexArrays.
                          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50),
              vertexArrays.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_330,
              (DrawUtilCallback *)0x0);
    (**(code **)(local_418 + 0x1220))
              (0,0,0x20,0x20,0x8d99,0x1405,
               pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar4 = (**(code **)(local_418 + 0x800))();
    glu::checkError(dVar4,"After render",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                    ,0x17e);
    local_330 = (undefined1  [8])local_410;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
    std::operator<<((ostream *)&local_328,"  result = ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_330,
                        pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>," / ");
    hex_00.value._4_4_ = 0;
    hex_00.value._0_4_ =
         *pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start;
    tcu::Format::operator<<
              (&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,hex_00);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
    bVar2 = compare(this,__tmp,(float)local_428,(double)u64,
                    *pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
    if (bVar2) {
      fVar11 = *pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar2 = true;
      uVar10 = 0;
      uVar8 = 0;
      do {
        if (uVar8 == 0x20) break;
        ___tmp = uVar8;
        local_428 = uVar10;
        for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
          hex_01.value._4_4_ = 0;
          hex_01.value._0_4_ =
               *(float *)((long)pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar10);
          if (*(float *)((long)pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar10) != fVar11) {
            local_330 = (undefined1  [8])local_410;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
            std::operator<<((ostream *)&local_328,"ERROR: Inconsistent results, got ");
            tcu::Format::operator<<((ostream *)&local_328,hex_01);
            std::operator<<((ostream *)&local_328," at (");
            std::ostream::operator<<((ostringstream *)&local_328,(int)lVar7);
            std::operator<<((ostream *)&local_328,", ");
            std::ostream::operator<<((ostringstream *)&local_328,(int)___tmp);
            std::operator<<((ostream *)&local_328,")");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
            bVar2 = false;
          }
          uVar10 = uVar10 + 0x10;
        }
        uVar8 = ___tmp + 1;
        uVar10 = local_428 + 0x200;
      } while (bVar2);
      if (!bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Inconsistent values in framebuffer");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Result comparison failed");
    }
    iVar3 = iVar3 + 1;
  } while (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
           QP_TEST_RESULT_PASS);
  lVar7 = local_418;
  pcVar1 = *(code **)(local_418 + 0x78);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  (*pcVar1)(0x8d40,iVar3);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"After iteration",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                  ,0x1a9);
  iVar3 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar3;
  IVar9 = STOP;
  if (iVar3 < this->m_numIters) {
    IVar9 = (IterateResult)
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
            QP_TEST_RESULT_PASS);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pixels.super__Vector_base<float,_std::allocator<float>_>);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&vertexArrays);
  return IVar9;
}

Assistant:

ShaderFloatPrecisionCase::IterateResult ShaderFloatPrecisionCase::iterate (void)
{
	// Constant data.
	const float position[] =
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		 1.0f, -1.0f, 0.0f, 1.0f,
		 1.0f,  1.0f, 0.0f, 1.0f
	};
	const deUint16					indices[]	= { 0, 1, 2, 2, 1, 3 };

	const int						numVertices	= 4;
	float							in0Arr[4]	= { 0.0f };
	float							in1Arr[4]	= { 0.0f };

	TestLog&						log			= m_testCtx.getLog();
	const glw::Functions&			gl			= m_context.getRenderContext().getFunctions();
	vector<glu::VertexArrayBinding>	vertexArrays;

	// Image read from GL.
	std::vector<float>	pixels		(FRAMEBUFFER_WIDTH*FRAMEBUFFER_HEIGHT*4);

	// \todo [2012-05-03 pyry] Could be cached.
	deUint32			prog		= m_program->getProgram();

	gl.useProgram(prog);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	vertexArrays.push_back(glu::va::Float("a_position", 4, numVertices, 0, &position[0]));
	vertexArrays.push_back(glu::va::Float("a_in0", 1, numVertices, 0, &in0Arr[0]));
	vertexArrays.push_back(glu::va::Float("a_in1", 1, numVertices, 0, &in1Arr[0]));

	GLU_EXPECT_NO_ERROR(gl.getError(), "After program setup");

	// Compute values and reference.
	for (int testNdx = 0; testNdx < m_numTestsPerIter; testNdx++)
	{
		const float		in0		= m_rnd.getFloat(m_rangeA.x(), m_rangeA.y());
		const float		in1		= m_rnd.getFloat(m_rangeB.x(), m_rangeB.y());
		const double	refD	= m_evalFunc((double)in0, (double)in1);
		const float		refF	= tcu::Float64(refD).asFloat(); // Uses RTE rounding mode.

		log << TestLog::Message << "iter " << m_iterNdx << ", test " << testNdx << ": "
								<< "in0 = " << in0 << " / " << tcu::toHex(tcu::Float32(in0).bits())
								<< ", in1 = " << in1 << " / " << tcu::toHex(tcu::Float32(in1).bits())
			<< TestLog::EndMessage
			<< TestLog::Message << "  reference = " << refF << " / " << tcu::toHex(tcu::Float32(refF).bits()) << TestLog::EndMessage;

		std::fill(&in0Arr[0], &in0Arr[0] + DE_LENGTH_OF_ARRAY(in0Arr), in0);
		std::fill(&in1Arr[0], &in1Arr[0] + DE_LENGTH_OF_ARRAY(in1Arr), in1);

		glu::draw(m_context.getRenderContext(), prog, (int)vertexArrays.size(), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		gl.readPixels(0, 0, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "After render");

		log << TestLog::Message << "  result = " << pixels[0] << " / " << tcu::toHex(tcu::Float32(pixels[0]).bits()) << TestLog::EndMessage;

		// Verify results
		{
			const bool firstPixelOk = compare(in0, in1, refD, pixels[0]);

			if (firstPixelOk)
			{
				// Check that rest of pixels match to first one.
				const deUint32	firstPixelBits	= tcu::Float32(pixels[0]).bits();
				bool			allPixelsOk		= true;

				for (int y = 0; y < FRAMEBUFFER_HEIGHT; y++)
				{
					for (int x = 0; x < FRAMEBUFFER_WIDTH; x++)
					{
						const deUint32 pixelBits = tcu::Float32(pixels[(y*FRAMEBUFFER_WIDTH + x)*4]).bits();

						if (pixelBits != firstPixelBits)
						{
							log << TestLog::Message << "ERROR: Inconsistent results, got " << tcu::toHex(pixelBits) << " at (" << x << ", " << y << ")" << TestLog::EndMessage;
							allPixelsOk = false;
						}
					}

					if (!allPixelsOk)
						break;
				}

				if (!allPixelsOk)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsistent values in framebuffer");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result comparison failed");
		}

		if (m_testCtx.getTestResult() != QP_TEST_RESULT_PASS)
			break;
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	GLU_EXPECT_NO_ERROR(gl.getError(), "After iteration");

	m_iterNdx += 1;
	return (m_iterNdx < m_numIters && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS) ? CONTINUE : STOP;
}